

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int32_t value)

{
  undefined4 in_register_00000034;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003c7878;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,value));
  *(long *)&this->fValue = (long)value;
  return;
}

Assistant:

Formattable::Formattable(int32_t value)
{
    init();
    fValue.fInt64 = value;
}